

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmath.c
# Opt level: O1

void xvm_sub(double *r,double *x,double *y,uint64_t N)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  
  if (N != 0) {
    uVar7 = 0;
    do {
      dVar1 = (x + uVar7)[1];
      dVar2 = x[uVar7 + 2];
      dVar3 = (x + uVar7 + 2)[1];
      dVar4 = (y + uVar7)[1];
      dVar5 = y[uVar7 + 2];
      dVar6 = (y + uVar7 + 2)[1];
      r[uVar7] = x[uVar7] - y[uVar7];
      (r + uVar7)[1] = dVar1 - dVar4;
      r[uVar7 + 2] = dVar2 - dVar5;
      (r + uVar7 + 2)[1] = dVar3 - dVar6;
      uVar7 = uVar7 + 4;
    } while (uVar7 < N);
  }
  return;
}

Assistant:

void xvm_sub(double r[], const double x[], const double y[], uint64_t N) {
#if defined(__SSE2__) && !defined(XVM_ANSI)
	assert(r != NULL && ((uintptr_t)r % 16) == 0);
	assert(x != NULL && ((uintptr_t)x % 16) == 0);
	assert(y != NULL && ((uintptr_t)y % 16) == 0);
	for (uint64_t n = 0; n < N; n += 4) {
		const __m128d x0 = _mm_load_pd(x + n    );
		const __m128d x1 = _mm_load_pd(x + n + 2);
		const __m128d y0 = _mm_load_pd(y + n    );
		const __m128d y1 = _mm_load_pd(y + n + 2);
		const __m128d r0 = _mm_sub_pd(x0, y0);
		const __m128d r1 = _mm_sub_pd(x1, y1);
		_mm_store_pd(r + n,     r0);
		_mm_store_pd(r + n + 2, r1);
	}
#else
	for (uint64_t n = 0; n < N; n++)
		r[n] = x[n] - y[n];
#endif
}